

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icmax1.c
# Opt level: O0

int icmax1_slu(int *n,singlecomplex *cx,int *incx)

{
  int local_3c;
  float local_38;
  int ix;
  int i;
  float smax;
  float r__1;
  int ret_val;
  int *incx_local;
  singlecomplex *cx_local;
  int *n_local;
  
  if (*n < 1) {
    n_local._4_4_ = 0.0;
  }
  else {
    smax = 1.4013e-45;
    if (*n == 1) {
      n_local._4_4_ = 1.4013e-45;
    }
    else if (*incx == 1) {
      ix = (int)ABS(cx->r);
      for (local_38 = 2.8026e-45; (int)local_38 <= *n; local_38 = (float)((int)local_38 + 1)) {
        if ((float)ix < ABS(cx[(int)local_38 + -1].r)) {
          smax = local_38;
          ix = (int)ABS(cx[(int)local_38 + -1].r);
        }
      }
      n_local._4_4_ = smax;
    }
    else {
      ix = (int)ABS(cx->r);
      local_3c = *incx + 1;
      for (local_38 = 2.8026e-45; (int)local_38 <= *n; local_38 = (float)((int)local_38 + 1)) {
        if ((float)ix < ABS(cx[local_3c + -1].r)) {
          smax = local_38;
          ix = (int)ABS(cx[local_3c + -1].r);
        }
        local_3c = *incx + local_3c;
      }
      n_local._4_4_ = smax;
    }
  }
  return (int)n_local._4_4_;
}

Assistant:

int icmax1_slu(int *n, singlecomplex *cx, int *incx)
{
/*
       NEXT LINE IS THE ONLY MODIFICATION.   

    
   Parameter adjustments   
       Function Body */
    /* System generated locals */
    int ret_val;
    float r__1;
    /* Local variables */
    float smax;
    int i, ix;


#define CX(I) cx[(I)-1]


    ret_val = 0;
    if (*n < 1) {
	return ret_val;
    }
    ret_val = 1;
    if (*n == 1) {
	return ret_val;
    }
    if (*incx == 1) {
	goto L30;
    }

/*     CODE FOR INCREMENT NOT EQUAL TO 1 */

    ix = 1;
    smax = (r__1 = CX(1).r, fabs(r__1));
    ix += *incx;
    for (i = 2; i <= *n; ++i) {
	if ((r__1 = CX(ix).r, fabs(r__1)) <= smax) {
	    goto L10;
	}
	ret_val = i;
	smax = (r__1 = CX(ix).r, fabs(r__1));
L10:
	ix += *incx;
/* L20: */
    }
    return ret_val;

/*     CODE FOR INCREMENT EQUAL TO 1 */

L30:
    smax = (r__1 = CX(1).r, fabs(r__1));
    for (i = 2; i <= *n; ++i) {
	if ((r__1 = CX(i).r, fabs(r__1)) <= smax) {
	    goto L40;
	}
	ret_val = i;
	smax = (r__1 = CX(i).r, fabs(r__1));
L40:
	;
    }
    return ret_val;

/*     End of ICMAX1 */

}